

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::Image::bindMemory
          (Image *this,MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *allocation)

{
  Allocation *pAVar1;
  VkResult result;
  
  pAVar1 = (allocation->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).
           m_data.ptr;
  result = (*this->m_vk->_vptr_DeviceInterface[0xd])
                     (this->m_vk,this->m_device,
                      (this->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,(pAVar1->m_memory).m_internal,pAVar1->m_offset);
  ::vk::checkResult(result,
                    "m_vk.bindImageMemory(m_device, *m_object, allocation->getMemory(), allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x32d);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&this->m_allocation,allocation);
  return;
}

Assistant:

void Image::bindMemory (de::MovePtr<vk::Allocation> allocation)
{
	DE_ASSERT(allocation);
	VK_CHECK(m_vk.bindImageMemory(m_device, *m_object, allocation->getMemory(), allocation->getOffset()));

	DE_ASSERT(!m_allocation);
	m_allocation = allocation;
}